

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_padding.cpp
# Opt level: O0

int test_padding(int w,int h,int c,int top,int bottom,int left,int right,int type,float value,
                int per_channel_pad_data_size)

{
  int iVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int ret;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  ParamDict pd;
  Mat a;
  undefined4 in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b4;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  int in_stack_fffffffffffff5c0;
  int in_stack_fffffffffffff5c4;
  int in_stack_fffffffffffff5c8;
  int in_stack_fffffffffffff5cc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_998;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_970 [17];
  _func_void_Padding_ptr *in_stack_fffffffffffff828;
  float in_stack_fffffffffffff834;
  Mat *in_stack_fffffffffffff838;
  Option *in_stack_fffffffffffff840;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff848;
  ParamDict *in_stack_fffffffffffff850;
  char *in_stack_fffffffffffff858;
  
  RandomMat(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c4);
  ncnn::ParamDict::ParamDict
            ((ParamDict *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  ncnn::ParamDict::set((ParamDict *)local_970,0,in_ECX);
  ncnn::ParamDict::set((ParamDict *)local_970,1,in_R8D);
  ncnn::ParamDict::set((ParamDict *)local_970,2,in_R9D);
  ncnn::ParamDict::set((ParamDict *)local_970,3,in_stack_00000008);
  ncnn::ParamDict::set((ParamDict *)local_970,4,in_stack_00000010);
  ncnn::ParamDict::set((ParamDict *)local_970,5,in_XMM0_Da);
  ncnn::ParamDict::set((ParamDict *)local_970,6,in_stack_00000018);
  std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x116a36);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            (in_stack_fffffffffffff5d0,CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8)
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
  std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x116a5c);
  if (in_stack_00000018 != 0) {
    RandomMat(in_stack_fffffffffffff5cc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_998,0);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
               (Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
    ncnn::Mat::~Mat((Mat *)0x116aa7);
  }
  ncnn::Option::Option((Option *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
  iVar1 = test_layer<ncnn::Padding>
                    (in_stack_fffffffffffff858,in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                     in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff834,
                     in_stack_fffffffffffff828);
  if (iVar1 != 0) {
    fprintf(_stderr,
            "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n"
            ,(double)in_XMM0_Da,(ulong)in_EDI,(ulong)in_ESI,(ulong)in_EDX,(ulong)in_ECX,in_R8D,
            in_R9D,in_stack_00000008,in_stack_00000010,in_stack_00000018);
    in_stack_fffffffffffff5c0 = in_stack_00000010;
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
             CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
  ncnn::ParamDict::~ParamDict
            ((ParamDict *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
  ncnn::Mat::~Mat((Mat *)0x116c55);
  return iVar1;
}

Assistant:

static int test_padding(int w, int h, int c, int top, int bottom, int left, int right, int type, float value, int per_channel_pad_data_size)
{
    ncnn::Mat a = RandomMat(w, h, c);

    ncnn::ParamDict pd;
    pd.set(0, top);// top
    pd.set(1, bottom);// bottom
    pd.set(2, left);// left
    pd.set(3, right);// right
    pd.set(4, type);// type
    pd.set(5, value);// value
    pd.set(6, per_channel_pad_data_size);// per_channel_pad_data_size

    std::vector<ncnn::Mat> weights(per_channel_pad_data_size ? 1 : 0);
    if (per_channel_pad_data_size)
        weights[0] = RandomMat(per_channel_pad_data_size);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Padding>("Padding", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_padding failed w=%d h=%d c=%d top=%d bottom=%d left=%d right=%d type=%d value=%f per_channel_pad_data_size=%d\n", w, h, c, top, bottom, left, right, type, value, per_channel_pad_data_size);
    }

    return ret;
}